

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue_to_string.c
# Opt level: O1

char * amqpvalue_to_string(AMQP_VALUE amqp_value)

{
  bool bVar1;
  AMQP_TYPE AVar2;
  int iVar3;
  AMQP_VALUE pAVar4;
  LOGGER_LOG p_Var5;
  char *to_concat;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  char *result;
  double double_value;
  char *string_value;
  uint32_t count_2;
  char *local_68;
  undefined8 local_60;
  amqp_binary local_58 [2];
  uint local_34;
  
  local_68 = (char *)0x0;
  if (amqp_value == (AMQP_VALUE)0x0) {
    return (char *)0x0;
  }
  AVar2 = amqpvalue_get_type(amqp_value);
  switch(AVar2) {
  case AMQP_TYPE_NULL:
    iVar3 = string_concat(&local_68,"NULL");
    if (iVar3 == 0) {
      return local_68;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
    pcVar7 = "Failure building amqp value string";
    iVar3 = 0x49;
    break;
  case AMQP_TYPE_BOOL:
    iVar3 = amqpvalue_get_boolean(amqp_value,(_Bool *)local_58);
    if (iVar3 == 0) {
      pcVar7 = "false";
      if ((char)local_58[0].bytes != '\0') {
        pcVar7 = "true";
      }
      iVar3 = string_concat(&local_68,pcVar7);
      if (iVar3 == 0) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x59;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting bool value";
      iVar3 = 0x53;
    }
    break;
  case AMQP_TYPE_UBYTE:
    iVar3 = amqpvalue_get_ubyte(amqp_value,(uchar *)&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%u",(ulong)(byte)local_60);
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x6c;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting ubyte value";
      iVar3 = 0x65;
    }
    break;
  case AMQP_TYPE_USHORT:
    iVar3 = amqpvalue_get_ushort(amqp_value,(uint16_t *)&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%u",(ulong)CONCAT11(local_60._1_1_,(byte)local_60));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x7f;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting ushort value";
      iVar3 = 0x78;
    }
    break;
  case AMQP_TYPE_UINT:
    iVar3 = amqpvalue_get_uint(amqp_value,(uint32_t *)&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%u",
                      (ulong)CONCAT22(local_60._2_2_,CONCAT11(local_60._1_1_,(byte)local_60)));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x92;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting uint value";
      iVar3 = 0x8b;
    }
    break;
  case AMQP_TYPE_ULONG:
    iVar3 = amqpvalue_get_ulong(amqp_value,&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%lu",
                      CONCAT44(local_60._4_4_,
                               CONCAT22(local_60._2_2_,CONCAT11(local_60._1_1_,(byte)local_60))));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0xa5;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting ulong value";
      iVar3 = 0x9e;
    }
    break;
  case AMQP_TYPE_BYTE:
    iVar3 = amqpvalue_get_byte(amqp_value,(char *)&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%d",(ulong)(uint)(int)(char)(byte)local_60);
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0xb8;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting byte value";
      iVar3 = 0xb1;
    }
    break;
  case AMQP_TYPE_SHORT:
    iVar3 = amqpvalue_get_short(amqp_value,(int16_t *)&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%d",
                      (ulong)(uint)(int)CONCAT11(local_60._1_1_,(byte)local_60));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0xcb;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting short value";
      iVar3 = 0xc4;
    }
    break;
  case AMQP_TYPE_INT:
    iVar3 = amqpvalue_get_int(amqp_value,(int32_t *)&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%d",
                      (ulong)CONCAT22(local_60._2_2_,CONCAT11(local_60._1_1_,(byte)local_60)));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0xde;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting int value";
      iVar3 = 0xd7;
    }
    break;
  case AMQP_TYPE_LONG:
    iVar3 = amqpvalue_get_long(amqp_value,&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%ld",
                      CONCAT44(local_60._4_4_,
                               CONCAT22(local_60._2_2_,CONCAT11(local_60._1_1_,(byte)local_60))));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0xf1;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting long value";
      iVar3 = 0xea;
    }
    break;
  case AMQP_TYPE_FLOAT:
    iVar3 = amqpvalue_get_float(amqp_value,(float *)&local_60);
    if (iVar3 == 0) {
      iVar3 = snprintf((char *)local_58,0x19,"%.02f",
                       (double)(float)CONCAT22(local_60._2_2_,
                                               CONCAT11(local_60._1_1_,(byte)local_60)));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x106;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting float value";
      iVar3 = 0xfc;
    }
    break;
  case AMQP_TYPE_DOUBLE:
    iVar3 = amqpvalue_get_double(amqp_value,(double *)&local_60);
    if (iVar3 == 0) {
      iVar3 = snprintf((char *)local_58,0x19,"%.02lf",
                       CONCAT44(local_60._4_4_,
                                CONCAT22(local_60._2_2_,CONCAT11(local_60._1_1_,(byte)local_60))));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x11c;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting double value";
      iVar3 = 0x112;
    }
    break;
  case AMQP_TYPE_CHAR:
    iVar3 = amqpvalue_get_char(amqp_value,(uint32_t *)&local_60);
    if (iVar3 == 0) {
      iVar3 = snprintf((char *)local_58,0x19,"U%02X%02X%02X%02X",(ulong)(local_60._2_2_ >> 8),
                       (ulong)(local_60._2_2_ & 0xff),(ulong)local_60._1_1_,
                       CONCAT11(local_60._1_1_,(byte)local_60) & 0xff);
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x132;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting char value";
      iVar3 = 0x128;
    }
    break;
  case AMQP_TYPE_TIMESTAMP:
    iVar3 = amqpvalue_get_timestamp(amqp_value,&local_60);
    if (iVar3 == 0) {
      iVar3 = sprintf((char *)local_58,"%ld",
                      CONCAT44(local_60._4_4_,
                               CONCAT22(local_60._2_2_,CONCAT11(local_60._1_1_,(byte)local_60))));
      if ((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)local_58), iVar3 == 0)) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x146;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting timestamp value";
      iVar3 = 0x13f;
    }
    break;
  case AMQP_TYPE_UUID:
    iVar3 = amqpvalue_get_uuid(amqp_value,(uuid *)local_58);
    if (iVar3 == 0) {
      pcVar7 = UUID_to_string((UUID_T *)local_58);
      if (pcVar7 != (char *)0x0) {
        iVar3 = string_concat(&local_68,pcVar7);
        if (iVar3 == 0) goto LAB_0015c242;
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 != (LOGGER_LOG)0x0) {
          iVar3 = 0x162;
LAB_0015c224:
          (*p_Var5)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                    ,"amqpvalue_to_string",iVar3,1,"Failure building amqp value string");
        }
LAB_0015c22f:
        free(local_68);
        local_68 = (char *)0x0;
LAB_0015c242:
        free(pcVar7);
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting UUID stringified value";
      iVar3 = 0x15a;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting uuid value";
      iVar3 = 0x151;
    }
    break;
  case AMQP_TYPE_BINARY:
    iVar3 = amqpvalue_get_binary(amqp_value,local_58);
    if (iVar3 == 0) {
      iVar3 = string_concat(&local_68,"<");
      if (iVar3 == 0) {
        if (local_58[0].length == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          do {
            pcVar7 = " ";
            if (uVar8 == 0) {
              pcVar7 = "";
            }
            iVar3 = snprintf((char *)&local_60,4,"%s%02X",pcVar7,
                             (ulong)*(byte *)(CONCAT44(local_58[0].bytes._4_4_,
                                                       (uint)local_58[0].bytes) + uVar8));
          } while (((-1 < iVar3) && (iVar3 = string_concat(&local_68,(char *)&local_60), iVar3 == 0)
                   ) && (uVar8 = uVar8 + 1, uVar8 < local_58[0].length));
        }
        if ((local_58[0].length <= uVar8) && (iVar3 = string_concat(&local_68,">"), iVar3 == 0)) {
          return local_68;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 400;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x17b;
      }
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting binary value";
      iVar3 = 0x173;
    }
    break;
  case AMQP_TYPE_STRING:
    iVar3 = amqpvalue_get_string(amqp_value,(char **)local_58);
    if (iVar3 == 0) {
      iVar3 = string_concat(&local_68,
                            (char *)CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes));
      if (iVar3 == 0) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x1a5;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting string value";
      iVar3 = 0x19d;
    }
    break;
  case AMQP_TYPE_SYMBOL:
    iVar3 = amqpvalue_get_symbol(amqp_value,(char **)local_58);
    if (iVar3 == 0) {
      iVar3 = string_concat(&local_68,
                            (char *)CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes));
      if (iVar3 == 0) {
        return local_68;
      }
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure building amqp value string";
      iVar3 = 0x1b9;
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting symbol value";
      iVar3 = 0x1b1;
    }
    break;
  case AMQP_TYPE_LIST:
    iVar3 = amqpvalue_get_list_item_count(amqp_value,(uint32_t *)local_58);
    if (iVar3 == 0) {
      iVar3 = string_concat(&local_68,"{");
      if (iVar3 == 0) {
        if ((uint)local_58[0].bytes == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          do {
            pAVar4 = amqpvalue_get_list_item(amqp_value,uVar8);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x1d7,1,"Failure getting item %u from list",
                          (int)uVar8);
              }
              break;
            }
            pcVar7 = amqpvalue_to_string(pAVar4);
            if (pcVar7 == (char *)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x1df,1,"Failure converting item %u to string",
                          (int)uVar8);
              }
              amqpvalue_destroy(pAVar4);
              break;
            }
            if (((uVar8 != 0) && (iVar3 = string_concat(&local_68,","), iVar3 != 0)) ||
               (iVar3 = string_concat(&local_68,pcVar7), iVar3 != 0)) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x1e8,1,"Failure building amqp value string");
              }
              free(local_68);
              local_68 = (char *)0x0;
              break;
            }
            free(pcVar7);
            amqpvalue_destroy(pAVar4);
            uVar8 = uVar8 + 1;
          } while (uVar8 < (uint)local_58[0].bytes);
        }
        if (uVar8 < (uint)local_58[0].bytes) goto LAB_0015d08e;
        iVar3 = string_concat(&local_68,"}");
        if (iVar3 == 0) {
          return local_68;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x1fd;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x1cb;
      }
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting list item count value";
      iVar3 = 0x1c5;
    }
    break;
  case AMQP_TYPE_MAP:
    iVar3 = amqpvalue_get_map_pair_count(amqp_value,&local_34);
    if (iVar3 == 0) {
      iVar3 = string_concat(&local_68,"{");
      if (iVar3 == 0) {
        if (local_34 == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          do {
            iVar3 = amqpvalue_get_map_key_value_pair
                              (amqp_value,uVar6,(AMQP_VALUE *)local_58,(AMQP_VALUE *)&local_60);
            if (iVar3 == 0) {
              pcVar7 = amqpvalue_to_string((AMQP_VALUE)
                                           CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes)
                                          );
              if (pcVar7 == (char *)0x0) {
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                            ,"amqpvalue_to_string",0x224,1,
                            "Failure getting stringified key value for index %u",uVar6);
                }
                amqpvalue_destroy((AMQP_VALUE)
                                  CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes));
                amqpvalue_destroy((AMQP_VALUE)
                                  CONCAT44(local_60._4_4_,
                                           CONCAT22(local_60._2_2_,
                                                    CONCAT11(local_60._1_1_,(byte)local_60))));
                iVar3 = 0x65;
              }
              else {
                to_concat = amqpvalue_to_string((AMQP_VALUE)
                                                CONCAT44(local_60._4_4_,
                                                         CONCAT22(local_60._2_2_,
                                                                  CONCAT11(local_60._1_1_,
                                                                           (byte)local_60))));
                if (to_concat == (char *)0x0) {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                              ,"amqpvalue_to_string",0x22e,1,
                              "Failure getting stringified value for index %u",uVar6);
                  }
                  free(pcVar7);
                  amqpvalue_destroy((AMQP_VALUE)
                                    CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes));
                  amqpvalue_destroy((AMQP_VALUE)
                                    CONCAT44(local_60._4_4_,
                                             CONCAT22(local_60._2_2_,
                                                      CONCAT11(local_60._1_1_,(byte)local_60))));
                  iVar3 = 0x65;
                  bVar1 = false;
                }
                else if (((((uVar6 == 0) || (iVar3 = string_concat(&local_68,","), iVar3 == 0)) &&
                          ((iVar3 = string_concat(&local_68,"["), iVar3 == 0 &&
                           ((iVar3 = string_concat(&local_68,pcVar7), iVar3 == 0 &&
                            (iVar3 = string_concat(&local_68,":"), iVar3 == 0)))))) &&
                         (iVar3 = string_concat(&local_68,to_concat), iVar3 == 0)) &&
                        (iVar3 = string_concat(&local_68,"]"), iVar3 == 0)) {
                  free(to_concat);
                  free(pcVar7);
                  iVar3 = 0;
                  bVar1 = true;
                }
                else {
                  p_Var5 = xlogging_get_log_function();
                  if (p_Var5 != (LOGGER_LOG)0x0) {
                    (*p_Var5)(AZ_LOG_ERROR,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                              ,"amqpvalue_to_string",0x23d,1,"Failure building amqp value string");
                  }
                  free(pcVar7);
                  free(to_concat);
                  amqpvalue_destroy((AMQP_VALUE)
                                    CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes));
                  amqpvalue_destroy((AMQP_VALUE)
                                    CONCAT44(local_60._4_4_,
                                             CONCAT22(local_60._2_2_,
                                                      CONCAT11(local_60._1_1_,(byte)local_60))));
                  iVar3 = 0x65;
                  bVar1 = false;
                }
                if (bVar1) {
                  amqpvalue_destroy((AMQP_VALUE)
                                    CONCAT44(local_58[0].bytes._4_4_,(uint)local_58[0].bytes));
                  amqpvalue_destroy((AMQP_VALUE)
                                    CONCAT44(local_60._4_4_,
                                             CONCAT22(local_60._2_2_,
                                                      CONCAT11(local_60._1_1_,(byte)local_60))));
                  iVar3 = 0;
                }
              }
            }
            else {
              p_Var5 = xlogging_get_log_function();
              iVar3 = 0x65;
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x21c,1,"Failure getting key/value pair index %u",
                          uVar6);
              }
            }
          } while ((iVar3 == 0) && (uVar6 = uVar6 + 1, uVar6 < local_34));
        }
        if (uVar6 < local_34) goto LAB_0015d08e;
        iVar3 = string_concat(&local_68,"}");
        if (iVar3 == 0) {
          return local_68;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 600;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x20f;
      }
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting map pair count";
      iVar3 = 0x209;
    }
    break;
  case AMQP_TYPE_ARRAY:
    iVar3 = amqpvalue_get_array_item_count(amqp_value,(uint32_t *)local_58);
    if (iVar3 == 0) {
      iVar3 = string_concat(&local_68,"{");
      if (iVar3 == 0) {
        if ((uint)local_58[0].bytes == 0) {
          uVar6 = 0;
        }
        else {
          uVar6 = 0;
          do {
            pAVar4 = amqpvalue_get_array_item(amqp_value,uVar6);
            if (pAVar4 == (AMQP_VALUE)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x276,1,"Failure getting array item for index %u",
                          uVar6);
              }
              break;
            }
            pcVar7 = amqpvalue_to_string(pAVar4);
            if (pcVar7 == (char *)0x0) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x27e,1,
                          "Failure getting stringified array item value for index %u",uVar6);
              }
              amqpvalue_destroy(pAVar4);
              break;
            }
            if (((uVar6 != 0) && (iVar3 = string_concat(&local_68,","), iVar3 != 0)) ||
               (iVar3 = string_concat(&local_68,pcVar7), iVar3 != 0)) {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
                          ,"amqpvalue_to_string",0x287,1,"Failure building amqp value string");
              }
              free(local_68);
              local_68 = (char *)0x0;
              break;
            }
            free(pcVar7);
            amqpvalue_destroy(pAVar4);
            uVar6 = uVar6 + 1;
          } while (uVar6 < (uint)local_58[0].bytes);
        }
        if (uVar6 < (uint)local_58[0].bytes) goto LAB_0015d08e;
        iVar3 = string_concat(&local_68,"}");
        if (iVar3 == 0) {
          return local_68;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x29c;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x26a;
      }
    }
    else {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting array item count";
      iVar3 = 0x264;
    }
    break;
  case AMQP_TYPE_DESCRIBED:
  case AMQP_TYPE_COMPOSITE:
    pAVar4 = amqpvalue_get_inplace_described_value(amqp_value);
    if (pAVar4 == (AMQP_VALUE)0x0) {
      p_Var5 = xlogging_get_log_function();
      if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
      pcVar7 = "Failure getting described value";
      iVar3 = 0x2a9;
    }
    else {
      iVar3 = string_concat(&local_68,"* ");
      if (iVar3 == 0) {
        pcVar7 = amqpvalue_to_string(pAVar4);
        if (pcVar7 != (char *)0x0) {
          iVar3 = string_concat(&local_68,pcVar7);
          if (iVar3 == 0) goto LAB_0015c242;
          p_Var5 = xlogging_get_log_function();
          if (p_Var5 != (LOGGER_LOG)0x0) {
            iVar3 = 0x2c2;
            goto LAB_0015c224;
          }
          goto LAB_0015c22f;
        }
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure getting stringified described value";
        iVar3 = 0x2ba;
      }
      else {
        p_Var5 = xlogging_get_log_function();
        if (p_Var5 == (LOGGER_LOG)0x0) goto LAB_0015d08e;
        pcVar7 = "Failure building amqp value string";
        iVar3 = 0x2b1;
      }
    }
    break;
  default:
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return (char *)0x0;
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
              ,"amqpvalue_to_string",0x42,1,"Unknown AMQP type");
    return (char *)0x0;
  }
  (*p_Var5)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue_to_string.c"
            ,"amqpvalue_to_string",iVar3,1,pcVar7);
LAB_0015d08e:
  free(local_68);
  return (char *)0x0;
}

Assistant:

char* amqpvalue_to_string(AMQP_VALUE amqp_value)
{
    char* result = NULL;

    if (amqp_value != NULL)
    {
        AMQP_TYPE amqp_type = amqpvalue_get_type(amqp_value);
        switch (amqp_type)
        {
        default:
            LogError("Unknown AMQP type");
            result = NULL;
            break;

        case AMQP_TYPE_NULL:
            if (string_concat(&result, "NULL") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        case AMQP_TYPE_BOOL:
        {
            bool value;
            if (amqpvalue_get_boolean(amqp_value, &value) != 0)
            {
                LogError("Failure getting bool value");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, (value == true) ? "true" : "false") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_UBYTE:
        {
            char str_value[4];
            uint8_t value;
            if (amqpvalue_get_ubyte(amqp_value, &value) != 0)
            {
                LogError("Failure getting ubyte value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu8, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_USHORT:
        {
            char str_value[6];
            uint16_t value;
            if (amqpvalue_get_ushort(amqp_value, &value) != 0)
            {
                LogError("Failure getting ushort value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu16, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_UINT:
        {
            char str_value[11];
            uint32_t value;
            if (amqpvalue_get_uint(amqp_value, &value) != 0)
            {
                LogError("Failure getting uint value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu32, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_ULONG:
        {
            char str_value[21];
            uint64_t value;
            if (amqpvalue_get_ulong(amqp_value, &value) != 0)
            {
                LogError("Failure getting ulong value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRIu64, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_BYTE:
        {
            char str_value[5];
            char value;
            if (amqpvalue_get_byte(amqp_value, &value) != 0)
            {
                LogError("Failure getting byte value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId8, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_SHORT:
        {
            char str_value[7];
            int16_t value;
            if (amqpvalue_get_short(amqp_value, &value) != 0)
            {
                LogError("Failure getting short value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId16, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_INT:
        {
            char str_value[12];
            int32_t value;
            if (amqpvalue_get_int(amqp_value, &value) != 0)
            {
                LogError("Failure getting int value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId32, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_LONG:
        {
            char str_value[21];
            int64_t value;
            if (amqpvalue_get_long(amqp_value, &value) != 0)
            {
                LogError("Failure getting long value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId64, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_FLOAT:
        {
            float float_value;
            if (amqpvalue_get_float(amqp_value, &float_value) != 0)
            {
                LogError("Failure getting float value");
                free(result);
                result = NULL;
            }
            else
            {
                char str_value[25];
                if ((snprintf(str_value, sizeof(str_value), "%.02f", float_value) < 0) ||
                    (string_concat(&result, str_value) != 0))
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_DOUBLE:
        {
            double double_value;
            if (amqpvalue_get_double(amqp_value, &double_value) != 0)
            {
                LogError("Failure getting double value");
                free(result);
                result = NULL;
            }
            else
            {
                char str_value[25];
                if ((snprintf(str_value, sizeof(str_value), "%.02lf", double_value) < 0) ||
                    (string_concat(&result, str_value) != 0))
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_CHAR:
        {
            uint32_t char_code;
            if (amqpvalue_get_char(amqp_value, &char_code) != 0)
            {
                LogError("Failure getting char value");
                free(result);
                result = NULL;
            }
            else
            {
                char str_value[25];
                if ((snprintf(str_value, sizeof(str_value), "U%02X%02X%02X%02X", char_code >> 24, (char_code >> 16) & 0xFF, (char_code >> 8) & 0xFF, char_code & 0xFF) < 0) ||
                    (string_concat(&result, str_value) != 0))
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_TIMESTAMP:
        {
            char str_value[21];
            int64_t value;
            if (amqpvalue_get_timestamp(amqp_value, &value) != 0)
            {
                LogError("Failure getting timestamp value");
                free(result);
                result = NULL;
            }
            else if ((sprintf(str_value, "%" PRId64, value) < 0) ||
                     (string_concat(&result, str_value) != 0))
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            break;
        }
        case AMQP_TYPE_UUID:
        {
            uuid uuid_value;
            if (amqpvalue_get_uuid(amqp_value, &uuid_value) != 0)
            {
                LogError("Failure getting uuid value");
                free(result);
                result = NULL;
            }
            else
            {
                char* uuid_string_value = UUID_to_string((const UUID_T *)&uuid_value);
                if (uuid_string_value == NULL)
                {
                    LogError("Failure getting UUID stringified value");
                    free(result);
                    result = NULL;
                }
                else
                {
                    if (string_concat(&result, uuid_string_value) != 0)
                    {
                        LogError("Failure building amqp value string");
                        free(result);
                        result = NULL;
                    }

                    free(uuid_string_value);
                }
            }

            break;
        }

        case AMQP_TYPE_BINARY:
        {
            amqp_binary binary_value;
            if (amqpvalue_get_binary(amqp_value, &binary_value) != 0)
            {
                LogError("Failure getting binary value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, "<") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
                else
                {
                    uint64_t i;

                    for (i = 0; i < binary_value.length; i++)
                    {
                        char str_value[4];
                        if ((snprintf(str_value, sizeof(str_value), "%s%02X", (i > 0) ? " " : "", ((unsigned char*)binary_value.bytes)[i]) < 0) ||
                            (string_concat(&result, str_value) != 0))
                        {
                            break;
                        }
                    }

                    if ((i < binary_value.length) ||
                        (string_concat(&result, ">") != 0))
                    {
                        LogError("Failure building amqp value string");
                        free(result);
                        result = NULL;
                    }
                }
            }
            break;
        }
        case AMQP_TYPE_STRING:
        {
            const char* string_value;
            if (amqpvalue_get_string(amqp_value, &string_value) != 0)
            {
                LogError("Failure getting string value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, string_value) != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_SYMBOL:
        {
            const char* string_value;
            if (amqpvalue_get_symbol(amqp_value, &string_value) != 0)
            {
                LogError("Failure getting symbol value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, string_value) != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_LIST:
        {
            uint32_t count;
            if (amqpvalue_get_list_item_count(amqp_value, &count) != 0)
            {
                LogError("Failure getting list item count value");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, "{") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            else
            {
                size_t i;
                for (i = 0; i < count; i++)
                {
                    AMQP_VALUE item = amqpvalue_get_list_item(amqp_value, i);
                    if (item == NULL)
                    {
                        LogError("Failure getting item %u from list", (unsigned int)i);
                        break;
                    }
                    else
                    {
                        char* item_string = amqpvalue_to_string(item);
                        if (item_string == NULL)
                        {
                            LogError("Failure converting item %u to string", (unsigned int)i);
                            amqpvalue_destroy(item);
                            break;
                        }
                        else
                        {
                            if (((i > 0) && (string_concat(&result, ",") != 0)) ||
                                 (string_concat(&result, item_string) != 0))
                            {
                                LogError("Failure building amqp value string");
                                free(result);
                                result = NULL;
                                break;
                            }

                            free(item_string);
                        }

                        amqpvalue_destroy(item);
                    }
                }

                if (i < count)
                {
                    // no log here, we already logged the error
                    free(result);
                    result = NULL;
                }
                else if (string_concat(&result, "}") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_MAP:
        {
            uint32_t count;
            if (amqpvalue_get_map_pair_count(amqp_value, &count) != 0)
            {
                LogError("Failure getting map pair count");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, "{") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            else
            {
                uint32_t i;
                for (i = 0; i < count; i++)
                {
                    AMQP_VALUE key;
                    AMQP_VALUE value;
                    if (amqpvalue_get_map_key_value_pair(amqp_value, i, &key, &value) != 0)
                    {
                        LogError("Failure getting key/value pair index %u", (unsigned int)i);
                        break;
                    }
                    else
                    {
                        char* key_string = amqpvalue_to_string(key);
                        if (key_string == NULL)
                        {
                            LogError("Failure getting stringified key value for index %u", (unsigned int)i);
                            amqpvalue_destroy(key);
                            amqpvalue_destroy(value);
                            break;
                        }
                        else
                        {
                            char* value_string = amqpvalue_to_string(value);
                            if (value_string == NULL)
                            {
                                LogError("Failure getting stringified value for index %u", (unsigned int)i);
                                free(key_string);
                                amqpvalue_destroy(key);
                                amqpvalue_destroy(value);
                                break;
                            }
                            else
                            {
                                if (((i > 0) && (string_concat(&result, ",") != 0)) ||
                                    (string_concat(&result, "[") != 0) ||
                                    (string_concat(&result, key_string) != 0) ||
                                    (string_concat(&result, ":") != 0) ||
                                    (string_concat(&result, value_string) != 0) ||
                                    (string_concat(&result, "]") != 0))
                                {
                                    LogError("Failure building amqp value string");
                                    free(key_string);
                                    free(value_string);
                                    amqpvalue_destroy(key);
                                    amqpvalue_destroy(value);
                                    break;
                                }

                                free(value_string);
                            }

                            free(key_string);
                        }

                        amqpvalue_destroy(key);
                        amqpvalue_destroy(value);
                    }
                }

                if (i < count)
                {
                    // no log here, we already logged the error
                    free(result);
                    result = NULL;
                }
                else if (string_concat(&result, "}") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_ARRAY:
        {
            uint32_t count;
            if (amqpvalue_get_array_item_count(amqp_value, &count) != 0)
            {
                LogError("Failure getting array item count");
                free(result);
                result = NULL;
            }
            else if (string_concat(&result, "{") != 0)
            {
                LogError("Failure building amqp value string");
                free(result);
                result = NULL;
            }
            else
            {
                uint32_t i;
                for (i = 0; i < count; i++)
                {
                    AMQP_VALUE item = amqpvalue_get_array_item(amqp_value, i);
                    if (item == NULL)
                    {
                        LogError("Failure getting array item for index %u", (unsigned int)i);
                        break;
                    }
                    else
                    {
                        char* item_string = amqpvalue_to_string(item);
                        if (item_string == NULL)
                        {
                            LogError("Failure getting stringified array item value for index %u", (unsigned int)i);
                            amqpvalue_destroy(item);
                            break;
                        }
                        else
                        {
                            if (((i > 0) && (string_concat(&result, ",") != 0)) ||
                                 (string_concat(&result, item_string) != 0))
                            {
                                LogError("Failure building amqp value string");
                                free(result);
                                result = NULL;
                                break;
                            }

                            free(item_string);
                        }

                        amqpvalue_destroy(item);
                    }
                }

                if (i < count)
                {
                    // no log here, we already logged the error
                    free(result);
                    result = NULL;
                }
                else if (string_concat(&result, "}") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
            }
            break;
        }
        case AMQP_TYPE_COMPOSITE:
        case AMQP_TYPE_DESCRIBED:
        {
            AMQP_VALUE described_value = amqpvalue_get_inplace_described_value(amqp_value);
            if (described_value == NULL)
            {
                LogError("Failure getting described value");
                free(result);
                result = NULL;
            }
            else
            {
                if (string_concat(&result, "* ") != 0)
                {
                    LogError("Failure building amqp value string");
                    free(result);
                    result = NULL;
                }
                else
                {
                    char* described_value_string = amqpvalue_to_string(described_value);
                    if (described_value_string == NULL)
                    {
                        LogError("Failure getting stringified described value");
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        if (string_concat(&result, described_value_string) != 0)
                        {
                            LogError("Failure building amqp value string");
                            free(result);
                            result = NULL;
                        }

                        free(described_value_string);
                    }
                }
            }
            break;
        }
        }
    }

    return result;
}